

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

TypeRef clickhouse::Type::CreateDateTime(string *timezone)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Type *in_RSI;
  element_type *in_RDI;
  TypeRef TVar2;
  TypeRef *type;
  element_type *this;
  uint3 in_stack_ffffffffffffffec;
  Code code;
  Type *this_00;
  
  code = (Code)in_stack_ffffffffffffffec;
  this = in_RDI;
  this_00 = in_RSI;
  operator_new(0x10);
  Type(this_00,code);
  std::shared_ptr<clickhouse::Type>::shared_ptr<clickhouse::Type,void>
            ((shared_ptr<clickhouse::Type> *)this,in_RSI);
  peVar1 = std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x24545e);
  std::__cxx11::string::operator=
            ((string *)
             &(((peVar1->field_1).array_)->item_type).
              super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)in_RSI);
  TVar2.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar2.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (TypeRef)TVar2.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Type::CreateDateTime(std::string timezone) {
    TypeRef type(new Type(Type::DateTime));
    type->date_time_->timezone = std::move(timezone);
    return type;
}